

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void qrdecomp(double *A,int M,int N,double *bvec)

{
  size_t __size;
  bool bVar1;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar2;
  int m;
  ulong uVar3;
  long lVar4;
  int N_00;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  
  if (N <= M) {
    lVar11 = (long)M;
    __size = lVar11 * 8;
    x = (double *)malloc(__size);
    v = (double *)malloc(__size);
    A_00 = (double *)malloc((long)N * __size);
    C = (double *)malloc(__size * lVar11);
    if (0 < N) {
      uVar9 = (ulong)(uint)M;
      uVar12 = (ulong)(uint)N;
      lVar10 = uVar12 << 0x20;
      pdVar5 = A + uVar12;
      uVar8 = 0;
      uVar13 = uVar12;
      uVar14 = uVar9;
      do {
        if ((long)uVar8 < lVar11) {
          uVar3 = 0;
          pdVar2 = A;
          do {
            x[uVar3] = *pdVar2;
            uVar3 = uVar3 + 1;
            pdVar2 = pdVar2 + uVar12;
          } while (uVar14 != uVar3);
        }
        N_00 = M - (int)uVar8;
        dVar15 = house(x,N_00,v);
        bvec[uVar8] = dVar15;
        if ((long)uVar8 < lVar11) {
          lVar4 = 0;
          pdVar2 = A;
          uVar3 = uVar8;
          do {
            uVar6 = 0;
            lVar7 = lVar4;
            do {
              *(double *)((long)A_00 + (lVar7 >> 0x1d)) = pdVar2[uVar6];
              lVar7 = lVar7 + (uVar14 << 0x20);
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
            uVar3 = uVar3 + 1;
            lVar4 = lVar4 + 0x100000000;
            pdVar2 = pdVar2 + uVar12;
          } while (uVar3 != uVar9);
        }
        m = N - (int)uVar8;
        mmult(A_00,v,C,m,N_00,1);
        if ((long)uVar8 < (long)uVar12) {
          uVar3 = 0;
          do {
            C[uVar3] = C[uVar3] * dVar15;
            uVar3 = uVar3 + 1;
          } while (uVar13 != uVar3);
        }
        mmult(v,C,A_00,N_00,1,m);
        if ((long)uVar8 < lVar11) {
          lVar4 = 0;
          pdVar2 = A;
          uVar3 = uVar8;
          do {
            uVar6 = 0;
            lVar7 = lVar4;
            do {
              pdVar2[uVar6] = pdVar2[uVar6] - *(double *)((long)A_00 + (lVar7 >> 0x1d));
              uVar6 = uVar6 + 1;
              lVar7 = lVar7 + 0x100000000;
            } while (uVar13 != uVar6);
            uVar3 = uVar3 + 1;
            pdVar2 = pdVar2 + uVar12;
            lVar4 = lVar4 + lVar10;
          } while (uVar3 != uVar9);
        }
        bVar1 = (long)uVar8 < lVar11;
        uVar8 = uVar8 + 1;
        if ((long)uVar8 < lVar11 && bVar1) {
          uVar3 = 1;
          pdVar2 = pdVar5;
          do {
            *pdVar2 = v[uVar3];
            uVar3 = uVar3 + 1;
            pdVar2 = pdVar2 + uVar12;
          } while (uVar14 != uVar3);
        }
        uVar14 = uVar14 - 1;
        A = A + uVar12 + 1;
        uVar13 = uVar13 - 1;
        lVar10 = lVar10 + -0x100000000;
        pdVar5 = pdVar5 + uVar12 + 1;
      } while (uVar8 != uVar12);
    }
    free(x);
    free(v);
    free(A_00);
    free(C);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void qrdecomp(double *A, int M, int N,double *bvec) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;
	
	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];
			
		}
		
		beta = house(x,M-j,v);
		bvec[j] = beta;
	
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);
				
			}
			
		}
		
		
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
		if (j < M) {
			for(i=j+1;i < M;++i) {
				A[i*N+j] = v[i-j];
			}
		}
		 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}